

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq2degComp.cpp
# Opt level: O1

void __thiscall Eq2degComp::computeRoots(Eq2degComp *this)

{
  pointer *ppcVar1;
  double dVar2;
  iterator iVar3;
  double dVar4;
  double local_38;
  double dStack_30;
  double local_28;
  undefined8 uStack_20;
  double local_18;
  
  local_38 = 0.0;
  dStack_30 = 0.0;
  dVar2 = *(double *)&this->field_0x20;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    uStack_20 = 0x8000000000000000;
    dVar4 = 0.0;
    local_28 = -*(double *)&this->field_0x10;
    local_18 = dVar2;
    dVar2 = csqrt(dVar2);
    dStack_30 = *(double *)&this->field_0x8 + *(double *)&this->field_0x8;
    local_38 = (local_28 - dVar2) / dStack_30;
    dStack_30 = -dVar4 / dStack_30;
    iVar3._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      _M_realloc_insert<std::complex<double>const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&this->m_rac,
                 iVar3,(complex<double> *)&local_38);
    }
    else {
      *(double *)(iVar3._M_current)->_M_value = local_38;
      *(double *)((iVar3._M_current)->_M_value + 8) = dStack_30;
      ppcVar1 = &(this->m_rac).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_28 = *(double *)&this->field_0x10;
    dVar4 = 0.0;
    dVar2 = csqrt(local_18);
    dStack_30 = *(double *)&this->field_0x8 + *(double *)&this->field_0x8;
    local_38 = (dVar2 - local_28) / dStack_30;
    dStack_30 = dVar4 / dStack_30;
    iVar3._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current !=
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010248d;
  }
  else {
    local_38 = -*(double *)&this->field_0x10 /
               (*(double *)&this->field_0x8 + *(double *)&this->field_0x8);
    dStack_30 = 0.0;
    iVar3._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current !=
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_0010248d:
      *(double *)(iVar3._M_current)->_M_value = local_38;
      *(double *)((iVar3._M_current)->_M_value + 8) = dStack_30;
      ppcVar1 = &(this->m_rac).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
      return;
    }
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_realloc_insert<std::complex<double>const&>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&this->m_rac,iVar3
             ,(complex<double> *)&local_38);
  return;
}

Assistant:

void Eq2degComp::computeRoots(){
    std::complex<double> zRoot;
    std::complex<double> zDelta = m_delta;
    if (m_delta == 0){
        zRoot = -m_b/(2*m_a);
        m_rac.push_back(zRoot);
    }else{
        zRoot = (-m_b-sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
        zRoot = (-m_b+sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
    }
}